

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O2

SplittingStepCoefficients SplittingStepCoefficients_SymmetricParallel(int partitions)

{
  sunrealtype *psVar1;
  sunrealtype ***pppsVar2;
  SplittingStepCoefficients pSVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int j;
  long lVar7;
  
  pSVar3 = SplittingStepCoefficients_Alloc(2,partitions,partitions);
  if (pSVar3 != (SplittingStepCoefficients)0x0) {
    pSVar3->order = 2;
    psVar1 = pSVar3->alpha;
    *psVar1 = 0.5;
    psVar1[1] = 0.5;
    lVar4 = (long)partitions;
    uVar5 = 0;
    uVar6 = 0;
    if (0 < partitions) {
      uVar6 = (ulong)(uint)partitions;
    }
    for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      partitions = partitions + -1;
      pppsVar2 = pSVar3->beta;
      (*pppsVar2)[lVar4][uVar5] = 1.0;
      for (lVar7 = (long)partitions; lVar7 < lVar4; lVar7 = lVar7 + 1) {
        pppsVar2[1][uVar5 + 1][lVar7] = 1.0;
      }
    }
  }
  return pSVar3;
}

Assistant:

SplittingStepCoefficients SplittingStepCoefficients_SymmetricParallel(
  const int partitions)
{
  const SplittingStepCoefficients coefficients =
    SplittingStepCoefficients_Alloc(2, partitions, partitions);
  if (coefficients == NULL) { return NULL; }

  coefficients->order    = 2;
  coefficients->alpha[0] = SUN_RCONST(0.5);
  coefficients->alpha[1] = SUN_RCONST(0.5);

  for (int i = 0; i < partitions; i++)
  {
    coefficients->beta[0][partitions][i] = SUN_RCONST(1.0);
    for (int j = partitions - i - 1; j < partitions; j++)
    {
      coefficients->beta[1][i + 1][j] = SUN_RCONST(1.0);
    }
  }

  return coefficients;
}